

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyEmptyImage
          (LayeredRenderCase *this,Surface *layer,bool logging)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  TestLog *this_00;
  Surface *__n;
  byte bVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  void *__buf;
  int iVar7;
  bool bVar8;
  int iVar9;
  char *__end;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool local_31b;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  LogImageSet local_280;
  undefined1 local_240 [120];
  ios_base local_1c8 [264];
  LogImage local_c0;
  
  uVar5 = CONCAT71(in_register_00000011,logging);
  uVar6 = uVar5;
  if ((int)uVar5 != 0) {
    local_240._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_240 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting empty image",0x15);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1c8);
    uVar6 = uVar5 & 0xffffffff;
  }
  bVar4 = (byte)uVar6;
  local_31b = layer->m_height < 1;
  if (0 < layer->m_height) {
    iVar7 = 0;
    do {
      iVar3 = layer->m_width;
      bVar8 = 0 < iVar3;
      if (0 < iVar3) {
        iVar9 = 0;
        do {
          uVar2 = *(uint *)((long)(layer->m_pixels).m_ptr + (long)(iVar3 * iVar7 + iVar9) * 4);
          bVar10 = 8 < (uVar2 & 0xff);
          bVar11 = 0x8ff < (uVar2 & 0xff00);
          bVar12 = 0x8ffff < (uVar2 & 0xff0000);
          if ((bVar11 && bVar10) && bVar12) {
            if ((char)uVar6 != '\0') {
              local_240._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_240 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Found (at least) one bad pixel at ",0x22);
              std::ostream::operator<<(poVar1,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
              std::ostream::operator<<(poVar1,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,". Pixel color is not background color.",0x26);
              this_00 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_240,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2e0,"LayerContent","");
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2a0,"Layer content","");
              tcu::LogImageSet::LogImageSet(&local_280,&local_2e0,&local_2a0);
              tcu::TestLog::startImageSet
                        (this_00,local_280.m_name._M_dataplus._M_p,
                         local_280.m_description._M_dataplus._M_p);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Layer","");
              local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Layer","");
              __n = layer;
              tcu::LogImage::LogImage
                        (&local_c0,&local_300,&local_2c0,layer,QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write(&local_c0,(int)this_00,__buf,(size_t)__n);
              tcu::TestLog::endImageSet(this_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
                operator_delete(local_c0.m_description._M_dataplus._M_p,
                                local_c0.m_description.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
                operator_delete(local_c0.m_name._M_dataplus._M_p,
                                local_c0.m_name.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                local_2c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
                operator_delete(local_280.m_description._M_dataplus._M_p,
                                local_280.m_description.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
                operator_delete(local_280.m_name._M_dataplus._M_p,
                                local_280.m_name.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_240 + 8));
              std::ios_base::~ios_base(local_1c8);
              uVar6 = uVar5 & 0xffffffff;
            }
            bVar4 = (byte)uVar6;
            if ((bVar11 && bVar10) && bVar12) {
              if (bVar8) goto LAB_01415b7c;
              break;
            }
          }
          iVar9 = iVar9 + 1;
          iVar3 = layer->m_width;
          bVar8 = iVar9 < iVar3;
        } while (iVar9 < iVar3);
      }
      bVar4 = (byte)uVar6;
      iVar7 = iVar7 + 1;
      local_31b = layer->m_height <= iVar7;
    } while (iVar7 < layer->m_height);
  }
LAB_01415b7c:
  if ((bVar4 & local_31b) == 1) {
    local_240._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_240 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Image is valid",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1c8);
    local_31b = true;
  }
  return local_31b;
}

Assistant:

bool LayeredRenderCase::verifyEmptyImage (const tcu::Surface& layer, bool logging)
{
	// Expect black
	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;

		if (!isBlack)
		{
			if (logging)
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
									<< tcu::TestLog::EndMessage
									<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
									<< tcu::TestLog::Image("Layer", "Layer", layer)
									<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}